

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptStringObject::DeleteProperty
          (JavascriptStringObject *this,JavascriptString *propertyNameString,
          PropertyOperationFlags propertyOperationFlags)

{
  bool bVar1;
  ScriptContext *scriptContext;
  char16 *varName;
  PropertyOperationFlags propertyOperationFlags_local;
  JavascriptString *propertyNameString_local;
  JavascriptStringObject *this_local;
  
  bVar1 = BuiltInPropertyRecord<7>::Equals
                    ((BuiltInPropertyRecord<7> *)BuiltInPropertyRecords::length,propertyNameString);
  if (bVar1) {
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    varName = JavascriptString::GetString(propertyNameString);
    JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags,scriptContext,varName);
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ =
         DynamicObject::DeleteProperty
                   (&this->super_DynamicObject,propertyNameString,propertyOperationFlags);
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptStringObject::DeleteProperty(JavascriptString *propertyNameString, PropertyOperationFlags propertyOperationFlags)
    {
        if (BuiltInPropertyRecords::length.Equals(propertyNameString))
        {
            JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags, this->GetScriptContext(), propertyNameString->GetString());

            return FALSE;
        }
        return DynamicObject::DeleteProperty(propertyNameString, propertyOperationFlags);
    }